

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O3

bool tcu::bilinearCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,RGBA threshold,CompareLogMode logMode)

{
  bool bVar1;
  ostream *poVar2;
  ConstPixelBufferAccess *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int __fd;
  TextureLevel errorMask;
  allocator<char> local_48a;
  allocator<char> local_489;
  string local_488;
  Vec4 local_468;
  Vec4 local_458;
  char *local_448;
  string local_440;
  string local_420;
  undefined1 local_400 [40];
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  LogImageSet local_338;
  LogImage local_2f8;
  TextureLevel local_268;
  LogImage local_240;
  undefined1 local_1b0 [32];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  local_1b0._0_4_ = RGB;
  local_1b0._4_4_ = UNORM_INT8;
  local_448 = imageSetDesc;
  TextureLevel::TextureLevel
            (&local_268,(TextureFormat *)local_1b0,(reference->m_size).m_data[0],
             (reference->m_size).m_data[1],1);
  PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_1b0,&local_268);
  bVar1 = bilinearCompare(reference,result,(PixelBufferAccess *)local_1b0,threshold);
  local_458.m_data[0] = 0.0;
  local_458.m_data[1] = 0.0;
  local_458.m_data[2] = 0.0;
  local_458.m_data[3] = 0.0;
  local_468.m_data[0] = 1.0;
  local_468.m_data[1] = 1.0;
  local_468.m_data[2] = 1.0;
  local_468.m_data[3] = 1.0;
  __fd = (int)log;
  if (logMode == COMPARE_LOG_EVERYTHING || !bVar1) {
    if ((((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) &&
       (((reference->m_format).order != RGBA || ((reference->m_format).type != UNORM_INT8)))) {
      anon_unknown_50::computeScaleAndBias(reference,result,&local_468,&local_458);
    }
    if (!bVar1) {
      local_1b0._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Image comparison failed, threshold = ",0x25);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"RGBA(",5);
      poVar2 = (ostream *)std::ostream::operator<<(local_1b0 + 8,threshold.m_value & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,threshold.m_value >> 8 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,threshold.m_value >> 0x10 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,threshold.m_value >> 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_138);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,imageSetName,&local_489)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,local_448,&local_48a);
    LogImageSet::LogImageSet(&local_338,&local_488,&local_358);
    TestLog::startImageSet
              (log,local_338.m_name._M_dataplus._M_p,local_338.m_description._M_dataplus._M_p);
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"Result","");
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Result","");
    LogImage::LogImage((LogImage *)local_1b0,&local_420,&local_378,result,&local_468,&local_458,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_1b0,__fd,__buf_00,(size_t)result);
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"Reference","");
    local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"Reference","");
    LogImage::LogImage(&local_2f8,&local_440,&local_398,reference,&local_468,&local_458,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write(&local_2f8,__fd,__buf_01,(size_t)reference);
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"ErrorMask","");
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"Error mask","");
    ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)local_400,&local_268);
    access = (ConstPixelBufferAccess *)local_400;
    LogImage::LogImage(&local_240,&local_3b8,&local_3d8,access,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write(&local_240,__fd,__buf_02,(size_t)access);
    TestLog::endImageSet(log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_description._M_dataplus._M_p != &local_2f8.m_description.field_2) {
      operator_delete(local_2f8.m_description._M_dataplus._M_p,
                      local_2f8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_name._M_dataplus._M_p != &local_2f8.m_name.field_2) {
      operator_delete(local_2f8.m_name._M_dataplus._M_p,
                      local_2f8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_description._M_dataplus._M_p != &local_338.m_description.field_2) {
      operator_delete(local_338.m_description._M_dataplus._M_p,
                      local_338.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_name._M_dataplus._M_p != &local_338.m_name.field_2) {
      operator_delete(local_338.m_name._M_dataplus._M_p,
                      local_338.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    local_240.m_name._M_dataplus._M_p = local_488._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p == &local_488.field_2) goto LAB_00a74f14;
  }
  else {
    if (logMode != COMPARE_LOG_RESULT) goto LAB_00a74f14;
    if (((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(result,&local_468,&local_458);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,imageSetName,(allocator<char> *)&local_358);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,local_448,(allocator<char> *)&local_420);
    LogImageSet::LogImageSet((LogImageSet *)&local_2f8,&local_240.m_name,&local_338.m_name);
    TestLog::startImageSet
              (log,local_2f8.m_name._M_dataplus._M_p,local_2f8.m_description._M_dataplus._M_p);
    local_400._0_8_ = (long)local_400 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"Result","");
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"Result","");
    LogImage::LogImage((LogImage *)local_1b0,(string *)local_400,&local_488,result,&local_468,
                       &local_458,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_1b0,__fd,__buf,(size_t)result);
    TestLog::endImageSet(log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    if (local_400._0_8_ != (long)local_400 + 0x10) {
      operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_description._M_dataplus._M_p != &local_2f8.m_description.field_2) {
      operator_delete(local_2f8.m_description._M_dataplus._M_p,
                      local_2f8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8.m_name._M_dataplus._M_p != &local_2f8.m_name.field_2) {
      operator_delete(local_2f8.m_name._M_dataplus._M_p,
                      local_2f8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_name._M_dataplus._M_p != &local_338.m_name.field_2) {
      operator_delete(local_338.m_name._M_dataplus._M_p,
                      local_338.m_name.field_2._M_allocated_capacity + 1);
    }
    local_488.field_2._M_allocated_capacity = local_240.m_name.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p == &local_240.m_name.field_2) goto LAB_00a74f14;
  }
  operator_delete(local_240.m_name._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
LAB_00a74f14:
  TextureLevel::~TextureLevel(&local_268);
  return bVar1;
}

Assistant:

bool bilinearCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const RGBA threshold, CompareLogMode logMode)
{
	TextureLevel		errorMask		(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), reference.getWidth(), reference.getHeight());
	bool				isOk			= bilinearCompare(reference, result, errorMask, threshold);
	Vec4				pixelBias		(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale		(1.0f, 1.0f, 1.0f, 1.0f);

	if (!isOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8) && reference.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computeScaleAndBias(reference, result, pixelScale, pixelBias);

		if (!isOk)
			log << TestLog::Message << "Image comparison failed, threshold = " << threshold << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result, pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return isOk;
}